

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

void Addr_EDI_disp8(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  size_t sVar1;
  size_t i;
  long MyNumber;
  
  MyNumber = (long)*(char *)((pMyDisasm->Reserved_).EIP_ + 2);
  (pMyOperand->Memory).Displacement = MyNumber;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar1 = printDisp8(pMyOperand,0,pMyDisasm,MyNumber);
    (pMyOperand->OpMnemonic + sVar1)[0] = '(';
    (pMyOperand->OpMnemonic + sVar1)[1] = '%';
    pMyOperand->OpMnemonic[sVar1 + 2] = '\0';
    sVar1 = sVar1 + 2;
  }
  else {
    sVar1 = 0;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,sVar1,'\a');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[3];
  }
  i = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    (pMyOperand->OpMnemonic + i)[0] = ')';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    return;
  }
  printDisp8(pMyOperand,i,pMyDisasm,MyNumber);
  return;
}

Assistant:

void __bea_callspec__ Addr_EDI_disp8(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
  size_t i = 0;
  long MyNumber;
  MyNumber = *((Int8*) (GV.EIP_+2));
  pMyOperand->Memory.Displacement = MyNumber;
  if (GV.SYNTAX_ == ATSyntax) {
    i = printDisp8(pMyOperand, i, pMyDisasm, MyNumber);
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
    #endif
    i+=2;
  }
  fillModrm0Register(pMyOperand, pMyDisasm, i, 7);
  if (GV.AddressSize == 16) {
    pMyOperand->Memory.BaseRegister = REGS[3];
  }

  i = strlen ((char*) &pMyOperand->OpMnemonic);
  if (GV.SYNTAX_ == ATSyntax) {
    #ifndef BEA_LIGHT_DISASSEMBLY
    (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
    i += 1;
    #endif
  }
  else {
    i = printDisp8(pMyOperand, i, pMyDisasm, MyNumber);
  }

}